

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.cpp
# Opt level: O3

int __thiscall MemFile::open(MemFile *this,char *__file,int __oflag,...)

{
  string *path;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  long lVar7;
  undefined7 extraout_var;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  long in_R8;
  string local_68;
  string local_48;
  
  puVar2 = (this->m_data).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_data).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->m_data).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_data,puVar2,__file,
             __file + __oflag);
  (this->m_it)._M_current =
       (this->m_data).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_assign((string *)this);
  path = &this->m_filename;
  uVar6 = std::__cxx11::string::_M_assign((string *)path);
  if (*(long *)(in_R8 + 8) == 0) {
    lVar7 = std::__cxx11::string::rfind((char)this,0x2f);
    paVar1 = &local_68.field_2;
    if (lVar7 == -1) {
      pcVar3 = (this->m_path)._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar3,pcVar3 + (this->m_path)._M_string_length);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_68,(ulong)this);
    }
    std::__cxx11::string::operator=((string *)path,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"gz","");
    bVar4 = IsFileExt(path,&local_68);
    bVar5 = true;
    if (!bVar4) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"xz","");
      bVar5 = IsFileExt(path,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (bVar5 == false) {
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"bz2","");
      bVar4 = IsFileExt(path,&local_68);
      uVar6 = CONCAT71(extraout_var,bVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        uVar6 = extraout_RAX;
      }
      if (!bVar4) goto LAB_0016482b;
    }
    std::__cxx11::string::substr((ulong)&local_68,(ulong)path);
    uVar6 = std::__cxx11::string::operator=((string *)path,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RAX_00;
    }
  }
LAB_0016482b:
  return (int)CONCAT71((int7)((ulong)uVar6 >> 8),1);
}

Assistant:

bool MemFile::open(const void* buf, int len, const std::string& path_, const std::string& filename_)
{
    auto pb = reinterpret_cast<const uint8_t*>(buf);

    m_data.clear();
    m_it = m_data.insert(m_data.begin(), pb, pb + len);
    m_path = path_;
    m_filename = filename_;

    // If a filename wasn't supplied from an archive, determine it here.
    if (filename_.empty())
    {
        std::string::size_type pos = m_path.rfind(PATH_SEPARATOR_CHR);
        m_filename = (pos == m_path.npos) ? m_path : m_path.substr(pos + 1);

        // Remove the archive extension from single compressed files.
        if (IsFileExt(m_filename, "gz") || IsFileExt(m_filename, "xz"))
            m_filename = m_filename.substr(0, m_filename.size() - 3);
        else if (IsFileExt(m_filename, "bz2"))
            m_filename = m_filename.substr(0, m_filename.size() - 4);
    }

    return true;
}